

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

void __thiscall
JPolComponent_VectorImplementation::ExportPolicyToFile
          (JPolComponent_VectorImplementation *this,string *path,Index *horizon)

{
  value_type vVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  void *pvVar5;
  Interface_ProblemToPolicyDiscretePure *pIVar6;
  const_reference ppPVar7;
  size_t sVar8;
  reference pvVar9;
  uint *in_RDX;
  long in_RDI;
  Index j;
  Index i_1;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numObvsHistory;
  Index nrAgents;
  ofstream fp;
  JPolComponent_VectorImplementation *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  size_type in_stack_fffffffffffffd18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd20;
  uint local_250;
  uint local_24c;
  uint local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  uint local_228;
  ostream local_218 [512];
  uint *local_18;
  
  local_18 = in_RDX;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_218,pcVar3,_S_out);
  poVar4 = std::operator<<(local_218,"Horizon : ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,*local_18);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  pIVar6 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffcf8);
  local_228 = (*(pIVar6->super_Interface_ProblemToPolicyDiscrete).
                _vptr_Interface_ProblemToPolicyDiscrete[3])();
  poVar4 = std::operator<<(local_218,"NrAgents : ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,local_228);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9892d9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9892ff);
  for (local_248 = 0; local_248 < local_228; local_248 = local_248 + 1) {
    pIVar6 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffcf8);
    ppPVar7 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                        ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                         (in_RDI + 0x30),(ulong)local_248);
    sVar8 = Policy::GetDepth((Policy *)*ppPVar7);
    vVar1 = (*(pIVar6->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[5])(pIVar6,(ulong)local_248,1,sVar8);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_240,(ulong)local_248);
    *pvVar9 = vVar1;
    poVar4 = (ostream *)std::ostream::operator<<(local_218,local_248);
    poVar4 = std::operator<<(poVar4," : ");
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_240,(ulong)local_248);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar9);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  for (local_24c = 0; local_24c < local_228; local_24c = local_24c + 1) {
    pvVar5 = (void *)std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    ppPVar7 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                        ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                         (in_RDI + 0x30),(ulong)local_24c);
    in_stack_fffffffffffffd14 =
         (*((*ppPVar7)->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._vptr_Policy[8])
                   (*ppPVar7,0);
    poVar4 = (ostream *)std::ostream::operator<<(local_218,in_stack_fffffffffffffd14);
    std::operator<<(poVar4," ");
    local_250 = 1;
    while( true ) {
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_240,(ulong)local_24c);
      if (*pvVar9 <= local_250) break;
      if (local_250 % 0x1e == 0) {
        std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
      }
      ppPVar7 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                          ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                           (in_RDI + 0x30),(ulong)local_24c);
      uVar2 = (*((*ppPVar7)->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy.
                _vptr_Policy[8])(*ppPVar7,(ulong)local_250);
      poVar4 = (ostream *)std::ostream::operator<<(local_218,uVar2);
      std::operator<<(poVar4," ");
      local_250 = local_250 + 1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void JPolComponent_VectorImplementation::ExportPolicyToFile(const std::string& path, const Index& horizon) const {
    ofstream fp(path.c_str());

    // Output horizon
    fp << "Horizon : " << horizon << endl;

    // Get nr agents and output to file
    Index nrAgents = GetInterfacePTPDiscretePure()->GetNrAgents();
    fp << "NrAgents : " << nrAgents << endl;


    vector<Index> numObvsHistory(nrAgents);

    // Get number of observation histories for each agent
    for(Index i=0; i<nrAgents; ++i) {

        numObvsHistory[i] = GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            i, PolicyGlobals::OHIST_INDEX, _m_indivPols_PolicyPureVector[i]->GetDepth());

        fp << i << " : " << numObvsHistory[i] << endl;
    }

    // Output policies for all agents
    for(Index i=0; i<nrAgents; ++i) {

        // Output policy
        fp << endl << endl;

        // Output first action
        fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(0) << " ";

        // Output rest
        for(Index j=1; j<numObvsHistory[i]; ++j) {

            // Break lines
            if(j % 30 == 0) {
                fp << endl;
            }

            fp << _m_indivPols_PolicyPureVector[i]->GetActionIndex(j) << " ";
        }
    }
}